

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O2

int __thiscall
icu_63::MeasureUnit::clone
          (MeasureUnit *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  MeasureUnit *this_00;
  
  this_00 = (MeasureUnit *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  if (this_00 != (MeasureUnit *)0x0) {
    MeasureUnit(this_00,this);
  }
  return (int)this_00;
}

Assistant:

UObject *MeasureUnit::clone() const {
    return new MeasureUnit(*this);
}